

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O0

uint32_t decimal64IsCanonical(decimal64 *d64)

{
  undefined1 local_4c [8];
  decContext dc;
  decimal64 canon;
  decNumber_conflict2 dn;
  decimal64 *d64_local;
  
  decContextDefault((decContext *)local_4c,0x40);
  decimal64ToNumber(d64,(decNumber_conflict2 *)&canon);
  decimal64FromNumber((decimal64 *)&dc.status,(decNumber_conflict2 *)&canon,(decContext *)local_4c);
  return (uint32_t)(*(long *)d64->bytes == dc._20_8_);
}

Assistant:

uint32_t decimal64IsCanonical(const decimal64 *d64) {
  decNumber dn;				/* work */
  decimal64 canon;			/* .. */
  decContext dc;			/* .. */
  decContextDefault(&dc, DEC_INIT_DECIMAL64);
  decimal64ToNumber(d64, &dn);
  decimal64FromNumber(&canon, &dn, &dc);/* canon will now be canonical */
  return memcmp(d64, &canon, DECIMAL64_Bytes)==0;
  }